

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubf1.c
# Opt level: O0

LispPTR N_OP_ubfloat1(LispPTR arg,int alpha)

{
  ushort uVar1;
  uint uVar2;
  float *pfVar3;
  LispPTR *pLVar4;
  uint *NAddr;
  int *fixpp;
  int val;
  float temp;
  LispPTR ret;
  float dest;
  LispPTR *wordp;
  int alpha_local;
  LispPTR arg_local;
  
  switch(alpha) {
  case 0:
    pLVar4 = (LispPTR *)createcell68k(3);
    *pLVar4 = arg;
    alpha_local = LAddrFromNative(pLVar4);
    break;
  case 1:
    if ((arg & 0xfff0000) == 0xe0000) {
      temp = (float)(arg & 0xffff);
    }
    else if ((arg & 0xfff0000) == 0xf0000) {
      temp = (float)(int)(arg | 0xffff0000);
    }
    else {
      uVar1 = *(ushort *)((ulong)(MDStypetbl + (arg >> 9)) ^ 2) & 0x7ff;
      if (uVar1 == 2) {
        pLVar4 = NativeAligned4FromLAddr(arg);
        temp = (float)(int)*pLVar4;
      }
      else {
        if (uVar1 != 3) {
          MachineState.tosvalue = arg;
          MachineState.errorexit = 1;
          return 0xffffffff;
        }
        pfVar3 = (float *)NativeAligned4FromLAddr(arg);
        temp = *pfVar3;
      }
    }
    alpha_local = (int)temp;
    break;
  case 2:
    alpha_local = arg & 0x7fffffff;
    break;
  case 3:
    alpha_local = arg ^ 0x80000000;
    break;
  case 4:
    if ((2.1474836e+09 < (float)arg) || ((float)arg < 2.1474836e+09)) {
      MachineState.errorexit = 1;
      alpha_local = -1;
      MachineState.tosvalue = arg;
    }
    else {
      uVar2 = (uint)(float)arg;
      if (uVar2 >> 0x10 == 0xffff) {
        alpha_local = uVar2 & 0xffff | 0xf0000;
      }
      else if (uVar2 >> 0x10 == 0) {
        alpha_local = uVar2 | 0xe0000;
      }
      else {
        NAddr = (uint *)createcell68k(2);
        *NAddr = uVar2;
        alpha_local = LAddrFromNative(NAddr);
      }
    }
    break;
  default:
    MachineState.errorexit = 1;
    alpha_local = -1;
    MachineState.tosvalue = arg;
  }
  return alpha_local;
}

Assistant:

LispPTR N_OP_ubfloat1(LispPTR arg, int alpha) {
  switch (alpha) {
    case 0: /* box */
    {
      LispPTR *wordp;
      wordp = createcell68k(TYPE_FLOATP);
      *wordp = arg;
      return (LAddrFromNative(wordp));
    }
    case 1: /* unbox */
    {
      float dest;
      LispPTR ret;
      N_MakeFloat(arg, dest, arg);
      ret = *(LispPTR *)&dest;
      return (ret);
    }
    case 2: /* abs */ return (0x7FFFFFFF & arg);
    case 3: /* neg */ return (0x80000000 ^ arg);
    case 4: /* ufix */
    {
      float temp;
      int val;
      temp = *(float *)&arg;
      if ((temp > ((float)0x7fffffff)) || (temp < ((float)0x80000000))) ERROR_EXIT(arg);
      val = (int)temp;
      N_ARITH_SWITCH(val);
    }
    default: ERROR_EXIT(arg);
  } /* end switch */
}